

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::Reference>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *result)

{
  bool bVar1;
  allocator local_329;
  string local_328;
  bool local_301;
  undefined1 local_300 [7];
  bool triple_deliminated_1;
  Reference ref_1;
  int local_1a8;
  char nc;
  char c;
  string local_1a0;
  bool local_179;
  undefined1 local_178 [7];
  bool triple_deliminated;
  Reference ref;
  vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *result_local;
  char end_symbol_local;
  char sep_local;
  AsciiParser *this_local;
  
  ref.customData._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)result;
  ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    Reference::Reference((Reference *)local_178);
    local_179 = false;
    bVar1 = ParseReference(this,(Reference *)local_178,&local_179);
    if (bVar1) {
      ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::push_back
                ((vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)
                 ref.customData._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (value_type *)local_178);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_1a0,"Failed to parse Reference.\n",(allocator *)&c);
      PushError(this,&local_1a0);
      ::std::__cxx11::string::~string((string *)&local_1a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&c);
      this_local._7_1_ = 0;
    }
    Reference::~Reference((Reference *)local_178);
    if (bVar1) {
      do {
        bVar1 = Eof(this);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_0053e5fb;
        }
        bVar1 = Char1(this,(char *)((long)&ref_1.customData._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count + 7));
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_0053e5fb;
        }
        if (ref_1.customData._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ == sep) {
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar1) {
            this_local._7_1_ = 0;
            goto LAB_0053e5fb;
          }
          bVar1 = LookChar1(this,(char *)((long)&ref_1.customData._M_t._M_impl.super__Rb_tree_header
                                                 ._M_node_count + 6));
          if (!bVar1) {
            this_local._7_1_ = 0;
            goto LAB_0053e5fb;
          }
          if (ref_1.customData._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ == end_symbol)
          break;
        }
        if (ref_1.customData._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ != sep) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_0053e5fb;
        }
        Reference::Reference((Reference *)local_300);
        local_301 = false;
        bVar1 = ParseReference(this,(Reference *)local_300,&local_301);
        if (bVar1) {
          ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::push_back
                    ((vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)
                     ref.customData._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (value_type *)local_300);
          local_1a8 = 0;
        }
        else {
          local_1a8 = 3;
        }
        Reference::~Reference((Reference *)local_300);
      } while (local_1a8 == 0);
      bVar1 = ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::empty
                        ((vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)
                         ref.customData._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_328,"Empty array.\n",&local_329);
        PushError(this,&local_328);
        ::std::__cxx11::string::~string((string *)&local_328);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_329);
        this_local._7_1_ = 0;
      }
      else {
        this_local._7_1_ = 1;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0053e5fb:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep,
                                  const char end_symbol,
                                  std::vector<Reference> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    Reference ref;
    bool triple_deliminated{false};

    if (!ParseReference(&ref, &triple_deliminated)) {
      PushError("Failed to parse Reference.\n");
      return false;
    }

    (void)triple_deliminated;

    result->push_back(ref);
  }

  while (!Eof()) {
    // sep
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    Reference ref;
    bool triple_deliminated{false};
    if (!ParseReference(&ref, &triple_deliminated)) {
      break;
    }

    (void)triple_deliminated;
    result->push_back(ref);
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}